

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void print_conditions(NODE *n)

{
  node *pnVar1;
  NODE *n_00;
  ulong uVar2;
  
  if (n != (NODE *)0x0) {
    do {
      pnVar1 = (n->u).QUERY.relattrlist;
      print_relattr((pnVar1->u).QUERY.relattrlist);
      uVar2 = (ulong)(pnVar1->u).CONDITION.op;
      if (uVar2 < 7) {
        printf(&DAT_0011d72c + *(int *)(&DAT_0011d72c + uVar2 * 4));
      }
      n_00 = (pnVar1->u).QUERY.conditionlist;
      if (n_00 == (NODE *)0x0) {
        print_value((pnVar1->u).UPDATE.conditionlist);
      }
      else {
        print_relattr(n_00);
      }
      if ((n->u).CREATETABLE.attrlist != (node *)0x0) {
        printf(" and");
      }
      n = (n->u).CREATETABLE.attrlist;
    } while (n != (node *)0x0);
  }
  return;
}

Assistant:

static void print_conditions(NODE *n)
{
   for(; n != NULL; n = n -> u.LIST.next){
      print_condition(n->u.LIST.curr);
      if(n -> u.LIST.next != NULL)
         printf(" and");
   }
}